

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c9fea::ConstructionBPM_PolyKeyValueINT_Test::
~ConstructionBPM_PolyKeyValueINT_Test(ConstructionBPM_PolyKeyValueINT_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConstructionBPM, PolyKeyValueINT) {
   
   PolynomialKeyList<int32_t>  poly_key;
   PolynomialValueList<double> poly_value;
   
   for (const auto &it: GeneratePolynomialINT()) {
      poly_key.push_back(it.first);
      poly_value.push_back(it.second);
   }
      
   BinaryPolynomialModel<int32_t, double> bpm(poly_key, poly_value, Vartype::SPIN);
   EXPECT_EQ(Vartype::SPIN, bpm.GetVartype());
   StateTestBPMINT(bpm);
}